

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

Status leveldb::SetCurrentFile(Env *env,string *dbname,uint64_t descriptor_number)

{
  bool bVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Slice *in_RDI;
  string tmp;
  Slice contents;
  string manifest;
  Status *s;
  string *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Slice *this;
  string *in_stack_fffffffffffffef8;
  undefined1 local_f8 [8];
  string local_f0 [24];
  Slice *in_stack_ffffffffffffff28;
  undefined1 local_d0 [8];
  string local_c8 [32];
  string local_a8 [8];
  uint64_t in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  string local_70 [32];
  Slice local_50;
  string local_40 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  this = in_RDI;
  local_10 = in_RSI;
  DescriptorFileName(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  Slice::Slice(this,in_stack_fffffffffffffee8);
  lVar2 = std::__cxx11::string::size();
  Slice::remove_prefix(&local_50,lVar2 + 1);
  TempFileName(in_stack_fffffffffffffef8,(uint64_t)this);
  pbVar3 = local_10;
  Slice::ToString_abi_cxx11_(in_stack_ffffffffffffff28);
  std::operator+(pbVar3,(char *)this);
  Slice::Slice(this,in_stack_fffffffffffffee8);
  WriteStringToFileSync((Env *)pbVar3,this,in_stack_fffffffffffffee8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  bVar1 = Status::ok((Status *)in_RDI);
  if (bVar1) {
    pbVar3 = local_10;
    CurrentFileName(local_10);
    (**(code **)(*(char **)pbVar3 + 0x60))(local_d0,pbVar3,local_70,local_f0);
    Status::operator=((Status *)this,(Status *)pbVar3);
    Status::~Status((Status *)this);
    std::__cxx11::string::~string(local_f0);
  }
  bVar1 = Status::ok((Status *)in_RDI);
  if (!bVar1) {
    (**(code **)(*(long *)local_10 + 0x40))(local_f8,local_10,local_70);
    Status::~Status((Status *)this);
  }
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_40);
  return (Status)(char *)this;
}

Assistant:

Status SetCurrentFile(Env* env, const std::string& dbname,
                      uint64_t descriptor_number) {
  // Remove leading "dbname/" and add newline to manifest file name
  std::string manifest = DescriptorFileName(dbname, descriptor_number);
  Slice contents = manifest;
  assert(contents.starts_with(dbname + "/"));
  contents.remove_prefix(dbname.size() + 1);
  std::string tmp = TempFileName(dbname, descriptor_number);
  Status s = WriteStringToFileSync(env, contents.ToString() + "\n", tmp);
  if (s.ok()) {
    s = env->RenameFile(tmp, CurrentFileName(dbname));
  }
  if (!s.ok()) {
    env->DeleteFile(tmp);
  }
  return s;
}